

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
fmt::v7::detail::write_bytes<char,std::back_insert_iterator<std::__cxx11::string>>
          (detail *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          out,string_view bytes,basic_format_specs<char> *specs)

{
  long lVar1;
  char *__dest;
  uint *puVar2;
  char *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  ulong n;
  ptrdiff_t _Num;
  ulong uVar3;
  
  puVar2 = (uint *)bytes.size_;
  __n = bytes.data_;
  uVar3 = 0;
  if (__n <= (char *)(ulong)*puVar2) {
    uVar3 = (long)(ulong)*puVar2 - (long)__n;
  }
  n = uVar3 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                         (ulong)(*(byte *)((long)puVar2 + 9) & 0xf)) & 0x3f);
  lVar1 = *(long *)(this + 8);
  std::__cxx11::string::resize
            ((ulong)this,
             *(char *)((long)puVar2 + 0xe) * (char)uVar3 + (char)lVar1 + (char)bytes.data_);
  __dest = fill<char*,char>((char *)(lVar1 + *(long *)this),n,(fill_t<char> *)((long)puVar2 + 10));
  if (__n != (char *)0x0) {
    memmove(__dest,out.container,(size_t)__n);
  }
  fill<char*,char>(__dest + (long)__n,uVar3 - n,(fill_t<char> *)((long)puVar2 + 10));
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
}

Assistant:

OutputIt write_bytes(OutputIt out, string_view bytes,
                     const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, bytes.size(), [bytes](iterator it) {
    const char* data = bytes.data();
    return copy_str<Char>(data, data + bytes.size(), it);
  });
}